

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O1

wchar_t decode_code_length(archive_read *a,rar5 *rar,uint8_t *p,uint16_t code)

{
  wchar_t wVar1;
  undefined8 in_RAX;
  undefined6 in_register_0000000a;
  uint uVar2;
  wchar_t wVar3;
  ulong uVar4;
  wchar_t add;
  wchar_t local_14;
  
  local_14 = (wchar_t)((ulong)in_RAX >> 0x20);
  uVar4 = CONCAT62(in_register_0000000a,code) & 0xffffffff;
  uVar2 = (uint)CONCAT62(in_register_0000000a,code);
  if ((ushort)uVar4 < 8) {
    wVar1 = L'\0';
  }
  else {
    wVar1 = (int)(uVar4 >> 2) + L'\xffffffff';
    uVar2 = (uVar2 & 3 | 4) << ((byte)wVar1 & 0x1f);
  }
  wVar3 = uVar2 + L'\x02';
  if (L'\0' < wVar1) {
    wVar1 = read_consume_bits(a,rar,p,wVar1,&local_14);
    wVar3 = wVar3 + local_14 | -(uint)(wVar1 != L'\0');
  }
  return wVar3;
}

Assistant:

static int decode_code_length(struct archive_read* a, struct rar5* rar,
	const uint8_t* p, uint16_t code)
{
	int lbits, length = 2;

	if(code < 8) {
		lbits = 0;
		length += code;
	} else {
		lbits = code / 4 - 1;
		length += (4 | (code & 3)) << lbits;
	}

	if(lbits > 0) {
		int add;

		if(ARCHIVE_OK != read_consume_bits(a, rar, p, lbits, &add))
			return -1;

		length += add;
	}

	return length;
}